

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O3

void P_SectorDamage(int tag,int amount,FName *type,PClassActor *protectClass,int flags)

{
  sector_t_conflict *sec;
  double dVar1;
  AActor *pAVar2;
  int amount_00;
  uint uVar3;
  extsector_t *peVar4;
  ulong uVar5;
  AActor *pAVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  FSectorTagIterator itr;
  FName local_48;
  int local_44;
  uint local_40;
  FName local_3c;
  FSectorTagIterator local_38;
  
  if (tag == 0) {
    local_38.start = 0;
  }
  else {
    local_38.start = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
  }
  local_38.searchtag = tag;
  uVar3 = FSectorTagIterator::Next(&local_38);
  if (-1 < (int)uVar3) {
    local_40 = flags | 4;
    local_44 = amount;
    do {
      amount_00 = local_44;
      sec = sectors + uVar3;
      pAVar6 = sectors[uVar3].thinglist;
      while (pAVar6 != (AActor *)0x0) {
        pAVar2 = pAVar6->snext;
        local_48 = (FName)type->Index;
        DoSectorDamage(pAVar6,(sector_t *)sec,amount_00,&local_48,protectClass,flags);
        pAVar6 = pAVar2;
      }
      peVar4 = sec->e;
      if ((peVar4->XFloor).attached.Count != 0) {
        uVar5 = 0;
        do {
          pAVar6 = (peVar4->XFloor).attached.Array[uVar5]->thinglist;
          if (pAVar6 != (AActor *)0x0) {
            do {
              pAVar2 = pAVar6->snext;
              dVar8 = (pAVar6->__Pos).X;
              dVar9 = (pAVar6->__Pos).Y;
              dVar7 = (sec->ceilingplane).negiC *
                      ((sec->ceilingplane).normal.Y * dVar9 +
                      (sec->ceilingplane).normal.X * dVar8 + (sec->ceilingplane).D);
              dVar8 = (sec->floorplane).negiC *
                      ((sec->floorplane).normal.Y * dVar9 +
                      (sec->floorplane).normal.X * dVar8 + (sec->floorplane).D);
              dVar9 = dVar7;
              if (dVar8 <= dVar7) {
                dVar9 = dVar8;
              }
              dVar1 = (pAVar6->__Pos).Z;
              if (dVar9 < pAVar6->Height + dVar1) {
                if (dVar8 <= dVar7) {
                  dVar8 = dVar7;
                }
                if (((flags & 4U) != 0) || (dVar1 <= dVar8 + 1.52587890625e-05)) {
                  local_3c = (FName)type->Index;
                  DoSectorDamage(pAVar6,(sector_t *)0x0,local_44,&local_3c,protectClass,local_40);
                }
              }
              pAVar6 = pAVar2;
            } while (pAVar2 != (AActor *)0x0);
            peVar4 = sec->e;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < (peVar4->XFloor).attached.Count);
      }
      uVar3 = FSectorTagIterator::Next(&local_38);
    } while (-1 < (int)uVar3);
  }
  return;
}

Assistant:

void P_SectorDamage(int tag, int amount, FName type, PClassActor *protectClass, int flags)
{
	FSectorTagIterator itr(tag);
	int secnum;
	while ((secnum = itr.Next()) >= 0)
	{
		AActor *actor, *next;
		sector_t *sec = &sectors[secnum];

		// Do for actors in this sector.
		for (actor = sec->thinglist; actor != NULL; actor = next)
		{
			next = actor->snext;
			DoSectorDamage(actor, sec, amount, type, protectClass, flags);
		}
		// If this is a 3D floor control sector, also do for anything in/on
		// those 3D floors.
		for (unsigned i = 0; i < sec->e->XFloor.attached.Size(); ++i)
		{
			sector_t *sec2 = sec->e->XFloor.attached[i];

			for (actor = sec2->thinglist; actor != NULL; actor = next)
			{
				next = actor->snext;
				// Only affect actors touching the 3D floor
				double z1 = sec->floorplane.ZatPoint(actor);
				double z2 = sec->ceilingplane.ZatPoint(actor);
				if (z2 < z1)
				{
					// Account for Vavoom-style 3D floors
					double zz = z1;
					z1 = z2;
					z2 = zz;
				}
				if (actor->Top() > z1)
				{
					// If DAMAGE_IN_AIR is used, anything not beneath the 3D floor will be
					// damaged (so, anything touching it or above it). Other 3D floors between
					// the actor and this one will not stop this effect.
					if ((flags & DAMAGE_IN_AIR) || !actor->isAbove(z2))
					{
						// Here we pass the DAMAGE_IN_AIR flag to disable the floor check, since it
						// only works with the real sector's floor. We did the appropriate height checks
						// for 3D floors already.
						DoSectorDamage(actor, NULL, amount, type, protectClass, flags | DAMAGE_IN_AIR);
					}
				}
			}
		}
	}
}